

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fair_mutex.hpp
# Opt level: O3

bool __thiscall yamc::fair::mutex::try_lock(mutex *this)

{
  size_t sVar1;
  size_t sVar2;
  int iVar3;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->mtx_);
  if (iVar3 == 0) {
    sVar1 = this->next_;
    sVar2 = this->curr_;
    if (sVar1 == sVar2) {
      this->next_ = sVar1 + 1;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->mtx_);
    return sVar1 == sVar2;
  }
  std::__throw_system_error(iVar3);
}

Assistant:

bool try_lock()
  {
    std::lock_guard<decltype(mtx_)> lk(mtx_);
    if (next_ != curr_)
      return false;
    ++next_;
    return true;
  }